

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  ImGuiContext *g;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  ImVec2 IVar14;
  float t1;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (((uint)flags >> 8 & 1) != 0) {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar4->ActiveId == id) {
      ClearActiveID();
    }
    return false;
  }
  uVar12 = (ulong)(flags | 2);
  if ((flags & 0x1eU) != 0) {
    uVar12 = (ulong)(uint)flags;
  }
  pIVar3 = pIVar4->HoveredWindow;
  if (((uVar12 & 0x20) == 0) || (pIVar4->HoveredRootWindow != window->RootWindow)) {
    bVar6 = false;
  }
  else {
    pIVar4->HoveredWindow = window;
    bVar6 = true;
  }
  bVar5 = ItemHoverable(bb,id);
  if (bVar5) {
    bVar10 = 1;
    if (((pIVar4->DragDropActive & 1U) != 0) && ((pIVar4->DragDropPayload).SourceId == id)) {
      bVar10 = ((byte)pIVar4->DragDropSourceFlags & 2) >> 1;
    }
  }
  else {
    bVar10 = 0;
  }
  uVar11 = (uint)uVar12;
  if ((((uVar11 >> 0xc & 1) == 0 || (~pIVar4->DragDropActive & 1U) != 0) ||
      ((pIVar4->DragDropSourceFlags & 4) != 0)) || (bVar5 = IsItemHovered(0x20), !bVar5)) {
LAB_0016df92:
    bVar5 = false;
  }
  else {
    SetHoveredID(id);
    t1 = pIVar4->HoveredIdTimer + 0.0001;
    iVar9 = CalcTypematicRepeatAmount(t1 - (pIVar4->IO).DeltaTime,t1,0.7,0.0);
    if (iVar9 == 0) {
      bVar10 = 1;
      goto LAB_0016df92;
    }
    FocusWindow(window);
    bVar10 = 1;
    bVar5 = true;
  }
  if (bVar6) {
    pIVar4->HoveredWindow = pIVar3;
  }
  if (bVar10 == 1 && (uVar12 & 0x40) != 0) {
    if (pIVar4->HoveredIdPreviousFrame == 0 || pIVar4->HoveredIdPreviousFrame == id)
    goto LAB_0016dfe0;
LAB_0016dfcf:
    bVar6 = false;
  }
  else {
    if (bVar10 == 0) goto LAB_0016dfcf;
LAB_0016dfe0:
    if (((uVar11 >> 10 & 1) == 0) ||
       ((((pIVar4->IO).KeyCtrl == false && ((pIVar4->IO).KeyShift == false)) &&
        ((pIVar4->IO).KeyAlt == false)))) {
      if (((uVar12 & 2) != 0) && ((pIVar4->IO).MouseClicked[0] == true)) {
        SetActiveID(id,window);
        if ((uVar11 >> 0xd & 1) == 0) {
          SetFocusID(id,window);
        }
        FocusWindow(window);
      }
      if ((((uVar12 & 4) != 0) && ((pIVar4->IO).MouseClicked[0] != false)) ||
         (((uVar12 & 0x10) != 0 && ((pIVar4->IO).MouseDoubleClicked[0] == true)))) {
        if ((uVar11 >> 0xb & 1) == 0) {
          SetActiveID(id,window);
        }
        else {
          ClearActiveID();
        }
        FocusWindow(window);
        bVar5 = true;
      }
      if (((uVar12 & 8) != 0) && ((pIVar4->IO).MouseReleased[0] == true)) {
        if (((uVar12 & 1) == 0) ||
           ((pIVar4->IO).MouseDownDurationPrev[0] < (pIVar4->IO).KeyRepeatDelay)) {
          bVar5 = true;
        }
        ClearActiveID();
      }
      if ((((uVar12 & 1) != 0) && (pIVar4->ActiveId == id)) &&
         (0.0 < (pIVar4->IO).MouseDownDuration[0])) {
        bVar6 = IsMouseClicked(0,true);
        if (bVar6) {
          bVar5 = true;
        }
      }
    }
    bVar6 = true;
    if (bVar5 != false) {
      pIVar4->NavDisableHighlight = true;
      bVar6 = true;
    }
  }
  if (((pIVar4->NavId == id) && (pIVar4->NavDisableHighlight == false)) &&
     (pIVar4->NavDisableMouseHover == true)) {
    IVar2 = pIVar4->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((uVar11 >> 0xe & 1) == 0) {
LAB_0016e13c:
        bVar6 = true;
      }
    }
    else if (((uVar11 >> 0xe & 1) == 0) && (IVar2 == window->MoveId)) goto LAB_0016e13c;
  }
  if (pIVar4->NavActivateDownId == id) {
    bVar13 = pIVar4->NavActivateId == id;
    bVar7 = IsNavInputTest(0,(uVar11 & 1) * 2 + ImGuiInputReadMode_Pressed);
    if (bVar7 || bVar13) {
      bVar5 = true;
    }
    else if (pIVar4->ActiveId != id) goto LAB_0016e1b6;
    pIVar4->NavActivateId = id;
    SetActiveID(id,window);
    if ((bVar7 || bVar13) && (uVar12 >> 0xd & 1) == 0) {
      SetFocusID(id,window);
    }
  }
LAB_0016e1b6:
  if (pIVar4->ActiveId == id) {
    if (bVar5 != false) {
      pIVar4->ActiveIdHasBeenPressedBefore = true;
    }
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar4->NavActivateDownId != id) {
        ClearActiveID();
      }
      bVar7 = false;
      goto LAB_0016e249;
    }
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        IVar1 = (pIVar4->IO).MousePos;
        IVar14.x = IVar1.x - (bb->Min).x;
        IVar14.y = IVar1.y - (bb->Min).y;
        pIVar4->ActiveIdClickOffset = IVar14;
      }
      bVar7 = true;
      if ((pIVar4->IO).MouseDown[0] == false) {
        bVar7 = bVar5;
        if ((bVar6 == true && (uVar12 & 2) != 0) && (pIVar4->DragDropActive == false)) {
          if ((uVar12 & 0x10) == 0) {
            cVar8 = '\0';
          }
          else {
            cVar8 = (pIVar4->IO).MouseDownWasDoubleClick[0];
          }
          if ((uVar12 & 1) == 0) {
            bVar13 = false;
          }
          else {
            bVar13 = (pIVar4->IO).KeyRepeatDelay <= (pIVar4->IO).MouseDownDurationPrev[0];
          }
          if ((cVar8 == '\0') && (bVar7 = true, bVar13)) {
            bVar7 = bVar5;
          }
        }
        bVar5 = bVar7;
        ClearActiveID();
        bVar7 = false;
      }
      if ((uVar11 >> 0xd & 1) == 0) {
        pIVar4->NavDisableHighlight = true;
      }
      goto LAB_0016e249;
    }
  }
  bVar7 = false;
LAB_0016e249:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar6;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar7;
  }
  return bVar5;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default behavior requires click+release on same spot
    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window->RootWindow;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        ImGuiTestEngineHook_ItemAdd(&g, bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicRepeatAmount(g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, g.HoveredIdTimer + 0.0001f, 0.70f, 0.00f))
            {
                pressed = true;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window);
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                FocusWindow(window);
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                if (flags & ImGuiButtonFlags_NoHoldingActiveID)
                    ClearActiveID();
                else
                    SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnNav))
            hovered = true;

    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            if (g.IO.MouseDown[0])
            {
                held = true;
            }
            else
            {
                if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) && !g.DragDropActive)
                {
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[0];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}